

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

void __thiscall wirehair::Codec::Substitute(Codec *this)

{
  ushort uVar1;
  bool bVar2;
  ushort uVar3;
  int *in_RDI;
  void *unaff_retaddr;
  void *in_stack_00000008;
  uint8_t *peel_src;
  uint16_t column_i;
  uint8_t *peel0;
  uint16_t column_1;
  uint16_t column_0;
  PeelRowIterator iter;
  uint8_t *src1;
  uint8_t *src0;
  uint8_t *src;
  RowMixIterator mix;
  uint8_t *input_src;
  uint8_t *dest;
  uint16_t dest_column_i;
  uint16_t row_i;
  PeelRow *row;
  int in_stack_000000dc;
  void *in_stack_000000e0;
  void *in_stack_000000e8;
  uint i;
  uint16_t x;
  uint16_t distanceToP;
  uint16_t distanceToP_1;
  uint16_t distanceToP_2;
  short local_ea;
  ushort local_e8;
  ushort local_e6;
  ushort local_e4;
  ushort local_e2;
  long local_e0;
  long local_d8;
  long local_d0;
  ushort local_c6 [3];
  long local_c0;
  long local_b8;
  ushort local_ac;
  ushort local_aa;
  long local_a8;
  int in_stack_ffffffffffffff6c;
  short *in_stack_ffffffffffffff70;
  short *in_stack_ffffffffffffff78;
  short *in_stack_ffffffffffffff80;
  uint local_4c;
  ushort local_46;
  ushort local_44;
  ushort local_42;
  long local_40;
  ushort *local_38;
  ushort local_30;
  ushort local_2e;
  ushort local_2c;
  ushort local_2a;
  ushort *local_28;
  ushort local_20;
  ushort local_1e;
  ushort local_1c;
  ushort local_1a;
  ushort *local_18;
  ushort local_10;
  ushort local_e;
  int in_stack_fffffffffffffff4;
  ushort *in_stack_fffffffffffffff8;
  
  local_aa = *(ushort *)(in_RDI + 0x22);
  while (local_aa != 0xffff) {
    local_a8 = *(long *)(in_RDI + 0x18) + (ulong)local_aa * 0x18;
    local_ac = *(ushort *)(local_a8 + 0x12);
    local_b8 = *(long *)(in_RDI + 8) + (ulong)(*in_RDI * (uint)local_ac);
    local_c0 = *(long *)(in_RDI + 0xc) + (ulong)(*in_RDI * (uint)local_aa);
    local_40 = local_a8 + 6;
    local_42 = *(ushort *)(in_RDI + 6);
    local_44 = *(ushort *)((long)in_RDI + 0x1a);
    local_38 = local_c6;
    uVar1 = *(ushort *)(local_a8 + 0xc);
    local_46 = uVar1;
    for (local_4c = 1; local_4c < 3; local_4c = local_4c + 1) {
      local_2e = *(ushort *)(local_a8 + 0xe);
      local_28 = &local_46;
      local_46 = (ushort)((ulong)((uint)local_46 + (uint)local_2e) %
                         (ulong)(long)(int)(uint)local_44);
      if (local_42 <= local_46) {
        local_30 = local_44 - local_46;
        if (local_2e < local_30) {
          local_46 = (ushort)(((uint)local_2e * 0x10000 - (uint)local_30) % (uint)local_2e);
        }
        else {
          local_46 = local_2e - local_30;
        }
      }
      local_38[local_4c] = local_46;
      local_2c = local_44;
      local_2a = local_42;
    }
    local_d0 = *(long *)(in_RDI + 8) +
               (ulong)(*in_RDI * ((uint)*(ushort *)(in_RDI + 1) + (uint)uVar1));
    if ((uint)local_aa == *(ushort *)(in_RDI + 1) - 1) {
      gf256_addset_mem(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,
                       in_stack_fffffffffffffff4);
      memcpy((void *)(local_b8 + (ulong)(uint)in_RDI[0xe]),
             (void *)(local_d0 + (ulong)(uint)in_RDI[0xe]),(ulong)(uint)(*in_RDI - in_RDI[0xe]));
    }
    else {
      gf256_addset_mem(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,
                       in_stack_fffffffffffffff4);
    }
    local_d8 = *(long *)(in_RDI + 8) +
               (ulong)(*in_RDI * ((uint)*(ushort *)(in_RDI + 1) + (uint)local_c6[1]));
    local_e0 = *(long *)(in_RDI + 8) +
               (ulong)(*in_RDI * ((uint)*(ushort *)(in_RDI + 1) + (uint)local_c6[2]));
    gf256_add2_mem(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                   in_stack_ffffffffffffff6c);
    if (1 < *(ushort *)(local_a8 + 6)) {
      in_stack_ffffffffffffff70 = (short *)(local_a8 + 6);
      local_e4 = *(ushort *)(in_RDI + 1);
      local_e2 = *(ushort *)((long)in_RDI + 6);
      in_stack_ffffffffffffff78 = &local_ea;
      in_stack_ffffffffffffff6c = CONCAT22(local_e4,local_e2);
      uVar1 = *(ushort *)(local_a8 + 8);
      local_e6 = *(ushort *)(local_a8 + 10);
      if (*in_stack_ffffffffffffff70 == 1) {
        local_ea = 0;
        uVar3 = uVar1;
      }
      else {
        local_ea = *in_stack_ffffffffffffff70 + -2;
        local_18 = &local_e8;
        local_1e = local_e6;
        local_1c = local_e2;
        local_1a = local_e4;
        uVar3 = (ushort)((ulong)((uint)uVar1 + (uint)local_e6) % (ulong)(long)(int)(uint)local_e2);
        if (local_e4 <= local_e8) {
          local_20 = local_e2 - local_e8;
          if (local_e6 < local_20) {
            uVar3 = (ushort)(((uint)local_e6 * 0x10000 - (uint)local_20) % (uint)local_e6);
          }
          else {
            uVar3 = local_e6 - local_20;
          }
        }
      }
      local_e8 = uVar3;
      if (uVar1 == local_ac) {
        gf256_add_mem(in_stack_000000e8,in_stack_000000e0,in_stack_000000dc);
      }
      else if (local_e8 == local_ac) {
        gf256_add_mem(in_stack_000000e8,in_stack_000000e0,in_stack_000000dc);
      }
      else {
        gf256_add2_mem(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
                       ,in_stack_ffffffffffffff6c);
      }
      while( true ) {
        if (local_ea == 0) {
          bVar2 = false;
        }
        else {
          local_ea = local_ea + -1;
          in_stack_fffffffffffffff8 = &local_e8;
          local_e = local_e6;
          in_stack_fffffffffffffff4 = CONCAT22(local_e4,local_e2);
          uVar1 = (ushort)((ulong)((uint)local_e8 + (uint)local_e6) %
                          (ulong)(long)(int)(uint)local_e2);
          if (local_e4 <= local_e8) {
            local_10 = local_e2 - local_e8;
            if (local_e6 < local_10) {
              uVar1 = (ushort)(((uint)local_e6 * 0x10000 - (uint)local_10) % (uint)local_e6);
            }
            else {
              uVar1 = local_e6 - local_10;
            }
          }
          local_e8 = uVar1;
          bVar2 = true;
        }
        if (!bVar2) break;
        in_stack_ffffffffffffff80 = &local_ea;
        if (local_e8 != local_ac) {
          gf256_add_mem(in_stack_000000e8,in_stack_000000e0,in_stack_000000dc);
        }
      }
    }
    local_aa = *(ushort *)(local_a8 + 4);
  }
  return;
}

Assistant:

void Codec::Substitute()
{
    CAT_IF_DUMP(cout << endl << "---- Substitute ----" << endl << endl;)

    CAT_IF_ROWOP(uint32_t rowops = 0;)

    PeelRow * GF256_RESTRICT row;

    // For each column that has been peeled:
    for (uint16_t row_i = _peel_head_rows; row_i != LIST_TERM; row_i = row->NextRow)
    {
        row = &_peel_rows[row_i];

        const uint16_t dest_column_i = row->Marks.Result.PeelColumn;
        CAT_DEBUG_ASSERT(dest_column_i < _recovery_rows);
        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * dest_column_i;

        CAT_IF_DUMP(cout << "Generating column " << dest_column_i << ":";)

        const uint8_t * GF256_RESTRICT input_src = _input_blocks + _block_bytes * row_i;
        CAT_IF_DUMP(cout << " " << row_i << ":[" << (unsigned)input_src[0] << "]";)

        const RowMixIterator mix(row->Params, _mix_count, _mix_next_prime);

        // Set up mixing column generator
        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[0]) < _recovery_rows);
        const uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[0]);

        // If copying from final block:
        if (row_i != _block_count - 1) {
            gf256_addset_mem(dest, src, input_src, _block_bytes);
        }
        else
        {
            gf256_addset_mem(dest, src, input_src, _input_final_bytes);
            memcpy(
                dest + _input_final_bytes,
                src + _input_final_bytes,
                _block_bytes - _input_final_bytes);
        }
        CAT_IF_ROWOP(++rowops;)

        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[1]) < _recovery_rows);
        const uint8_t * GF256_RESTRICT src0 = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[1]);
        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[2]) < _recovery_rows);
        const uint8_t * GF256_RESTRICT src1 = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[2]);

        // Add next two mixing columns in
        gf256_add2_mem(dest, src0, src1, _block_bytes);

        CAT_IF_ROWOP(++rowops;)

        // If at least two peeling columns are set:
        if (row->Params.PeelCount >= 2) // common case:
        {
            PeelRowIterator iter(row->Params, _block_count, _block_next_prime);

            const uint16_t column_0 = iter.GetColumn();
            iter.Iterate();
            const uint16_t column_1 = iter.GetColumn();

            // Common case:
            if (column_0 != dest_column_i)
            {
                CAT_DEBUG_ASSERT(column_0 < _recovery_rows);
                const uint8_t * GF256_RESTRICT peel0 = _recovery_blocks + _block_bytes * column_0;

                // Common case:
                if (column_1 != dest_column_i) {
                    CAT_DEBUG_ASSERT(column_1 < _recovery_rows);
                    gf256_add2_mem(dest, peel0, _recovery_blocks + _block_bytes * column_1, _block_bytes);
                }
                else {
                    gf256_add_mem(dest, peel0, _block_bytes);
                }
            }
            else {
                CAT_DEBUG_ASSERT(column_1 < _recovery_rows);
                gf256_add_mem(dest, _recovery_blocks + _block_bytes * column_1, _block_bytes);
            }
            CAT_IF_ROWOP(++rowops;)

            // For each remaining column:
            while (iter.Iterate())
            {
                const uint16_t column_i = iter.GetColumn();
                CAT_DEBUG_ASSERT(column_i < _recovery_rows);
                const uint8_t * GF256_RESTRICT peel_src = _recovery_blocks + _block_bytes * column_i;

                CAT_IF_DUMP(cout << " " << column_i;)

                // If column is not the solved one:
                if (column_i != dest_column_i)
                {
                    gf256_add_mem(dest, peel_src, _block_bytes);
                    CAT_IF_ROWOP(++rowops;)
                    CAT_IF_DUMP(cout << "[" << (unsigned)peel_src[0] << "]";)
                }
                else {
                    CAT_IF_DUMP(cout << "*";)
                }
            }
        } // end if weight 2

        CAT_IF_DUMP(cout << endl;)
    }

    CAT_IF_ROWOP(cout << "Substitute used " << rowops << " row ops = " << rowops / (double)_block_count << "*N" << endl;)
}